

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int tonumeral(expdesc *e,TValue *v)

{
  int iVar1;
  
  if (e->t != e->f) {
    return 0;
  }
  if (e->k == VKFLT) {
    if (v == (TValue *)0x0) {
      return 1;
    }
    iVar1 = 3;
  }
  else {
    if (e->k != VKINT) {
      return 0;
    }
    if (v == (TValue *)0x0) {
      return 1;
    }
    iVar1 = 0x13;
  }
  v->value_ = *(Value *)&e->u;
  v->tt_ = iVar1;
  return 1;
}

Assistant:

static int tonumeral (const expdesc *e, TValue *v) {
  if (hasjumps(e))
    return 0;  /* not a numeral */
  switch (e->k) {
    case VKINT:
      if (v) setivalue(v, e->u.ival);
      return 1;
    case VKFLT:
      if (v) setfltvalue(v, e->u.nval);
      return 1;
    default: return 0;
  }
}